

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Multi_Label.cxx
# Opt level: O0

void multi_measure(Fl_Label *o,int *w,int *h)

{
  int local_60;
  int local_5c;
  int H;
  int W;
  Fl_Label local;
  Fl_Multi_Label *b;
  int *h_local;
  int *w_local;
  Fl_Label *o_local;
  
  local._40_8_ = o->value;
  memcpy(&H,o,0x30);
  _H = *(char **)local._40_8_;
  local.color._0_1_ = *(undefined1 *)(local._40_8_ + 0x10);
  Fl_Label::measure((Fl_Label *)&H,w,h);
  _H = *(char **)(local._40_8_ + 8);
  local.color._0_1_ = *(undefined1 *)(local._40_8_ + 0x11);
  local_5c = 0;
  local_60 = 0;
  Fl_Label::measure((Fl_Label *)&H,&local_5c,&local_60);
  *w = local_5c + *w;
  if (*h < local_60) {
    *h = local_60;
  }
  return;
}

Assistant:

static void multi_measure(const Fl_Label* o, int& w, int& h) {
  Fl_Multi_Label* b = (Fl_Multi_Label*)(o->value);
  Fl_Label local = *o;
  local.value = b->labela;
  local.type = b->typea;
  local.measure(w,h);
  local.value = b->labelb;
  local.type = b->typeb;
  int W = 0; int H = 0; local.measure(W,H);
  w += W; if (H>h) h = H;
}